

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
TasGrid::MultiIndexManipulations::getMaxIndexes
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,MultiIndexSet *mset)

{
  uint uVar1;
  int iVar2;
  size_type __n;
  size_t sVar3;
  pointer piVar4;
  void *pvVar5;
  pointer piVar6;
  ulong uVar7;
  size_type sVar8;
  vector<int,_std::allocator<int>_> local_max_index;
  allocator_type local_4d;
  value_type_conflict3 local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  __n = mset->num_dimensions;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,__n,
             (value_type_conflict3 *)&local_48,(allocator_type *)&local_4c);
  uVar1 = mset->cache_num_indexes;
  local_4c = 0;
  ::std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_4c,&local_4d);
  pvVar5 = (void *)CONCAT44(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (0 < (int)uVar1) {
    sVar3 = mset->num_dimensions;
    piVar6 = (mset->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    do {
      if (__n != 0) {
        sVar8 = 0;
        do {
          if (*(int *)((long)pvVar5 + sVar8 * 4) < piVar6[sVar8]) {
            *(int *)((long)pvVar5 + sVar8 * 4) = piVar6[sVar8];
          }
          sVar8 = sVar8 + 1;
        } while (__n != sVar8);
      }
      uVar7 = uVar7 + 1;
      piVar6 = piVar6 + sVar3;
    } while (uVar7 != uVar1);
  }
  if (__n == 0) {
    if (pvVar5 == (void *)0x0) {
      return __return_storage_ptr__;
    }
  }
  else {
    piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar8 = 0;
    do {
      iVar2 = *(int *)((long)pvVar5 + sVar8 * 4);
      if (piVar4[sVar8] < iVar2) {
        piVar4[sVar8] = iVar2;
      }
      sVar8 = sVar8 + 1;
    } while (__n != sVar8);
  }
  operator_delete(pvVar5,(long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> getMaxIndexes(const MultiIndexSet &mset){
    size_t num_dimensions = mset.getNumDimensions();
    std::vector<int> max_index(num_dimensions, 0);
    int n = mset.getNumIndexes();

    #pragma omp parallel
    {
        std::vector<int> local_max_index(num_dimensions, 0);
        #pragma omp for
        for(int i=0; i<n; i++){
            const int* p = mset.getIndex(i);
            for(size_t j=0; j<num_dimensions; j++) if (local_max_index[j] < p[j]) local_max_index[j] = p[j];
        }
        #pragma omp critical
        {
            for(size_t j=0; j<num_dimensions; j++){
                if (max_index[j] < local_max_index[j]) max_index[j] = local_max_index[j];
            }
        }
    }

    return max_index;
}